

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_*(unsigned_long)>::UntypedPerformAction
          (FunctionMockerBase<void_*(unsigned_long)> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<void_*> *pAVar1;
  ArgumentTuple *args;
  Action<void_*(unsigned_long)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMockerBase<void_*(unsigned_long)> *this_local;
  
  action.impl_.link_.next_ = (linked_ptr_internal *)untyped_args;
  Action<void_*(unsigned_long)>::Action
            ((Action<void_*(unsigned_long)> *)&args,(Action<void_*(unsigned_long)> *)untyped_action)
  ;
  pAVar1 = ActionResultHolder<void*>::PerformAction<void*(unsigned_long)>
                     ((Action<void_*(unsigned_long)> *)&args,
                      (ArgumentTuple *)action.impl_.link_.next_);
  Action<void_*(unsigned_long)>::~Action((Action<void_*(unsigned_long)> *)&args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }